

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klvwalk.cpp
# Opt level: O3

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  size_t *psVar1;
  bool bVar2;
  CommandOptions *__s1;
  int iVar3;
  _List_node_base *p_Var4;
  CommandOptions *this_00;
  ulong uVar5;
  allocator<char> local_61;
  _List_node_base *local_60;
  bool *local_58;
  CommandOptions *local_50;
  _List_node_base *local_48;
  bool local_40;
  undefined7 uStack_3f;
  _List_node_base *p_Stack_38;
  
  this->error_flag = true;
  local_58 = &this->version_flag;
  local_60 = (_List_node_base *)&this->inFileList;
  this->version_flag = false;
  this->help_flag = false;
  this->verbose_flag = false;
  this->read_mxf_flag = false;
  this->walk_parts_flag = false;
  this->allow_skip_flag = false;
  (this->inFileList).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = local_60;
  (this->inFileList).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = local_60;
  (this->inFileList).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this_00 = this;
  if (1 < argc) {
    uVar5 = 1;
    do {
      __s1 = (CommandOptions *)argv[uVar5];
      this_00 = __s1;
      iVar3 = strcmp((char *)__s1,"-help");
      if (iVar3 == 0) {
        this->help_flag = true;
      }
      else if (__s1->error_flag == true) {
        bVar2 = __s1->version_flag;
        this_00 = (CommandOptions *)(ulong)(uint)(int)bVar2;
        iVar3 = isalpha((int)bVar2);
        if ((iVar3 == 0) || (__s1->help_flag != false)) {
switchD_00106481_caseD_71:
          fprintf(_stderr,"Unrecognized option: %s\n",__s1);
          return;
        }
        switch(bVar2) {
        case true:
          this->walk_parts_flag = true;
          break;
        case true:
        case true:
        case true:
          goto switchD_00106481_caseD_71;
        case true:
          this->read_mxf_flag = true;
          break;
        case true:
          this->allow_skip_flag = true;
          break;
        case true:
          this->verbose_flag = true;
          break;
        default:
          if (bVar2 == true) {
            *local_58 = true;
          }
          else {
            if (bVar2 != true) goto switchD_00106481_caseD_71;
            this->help_flag = true;
          }
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,(char *)__s1,&local_61);
        p_Var4 = (_List_node_base *)operator_new(0x30);
        p_Var4[1]._M_next = p_Var4 + 2;
        if (local_50 == (CommandOptions *)&local_40) {
          p_Var4[2]._M_next = (_List_node_base *)CONCAT71(uStack_3f,local_40);
          p_Var4[2]._M_prev = p_Stack_38;
        }
        else {
          p_Var4[1]._M_next = (_List_node_base *)local_50;
          p_Var4[2]._M_next = (_List_node_base *)CONCAT71(uStack_3f,local_40);
        }
        p_Var4[1]._M_prev = local_48;
        local_48 = (_List_node_base *)0x0;
        local_40 = false;
        local_50 = (CommandOptions *)&local_40;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        psVar1 = &(this->inFileList).
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        this_00 = local_50;
        if (local_50 != (CommandOptions *)&local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
      }
      uVar5 = uVar5 + 1;
    } while ((uint)argc != uVar5);
    if ((this->help_flag & 1U) != 0) {
      return;
    }
  }
  if (*local_58 == false) {
    if ((((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_60->_M_next)->_M_impl)._M_node.super__List_node_base._M_next == local_60) {
      CommandOptions(this_00);
    }
    else {
      this->error_flag = false;
    }
  }
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
     error_flag(true), version_flag(false), help_flag(false),
     verbose_flag(false), read_mxf_flag(false), walk_parts_flag(false),
     allow_skip_flag(false)
   {
     for ( int i = 1; i < argc; i++ )
       {

	 if ( (strcmp( argv[i], "-help") == 0) )
	   {
	     help_flag = true;
	     continue;
	   }
         
	 if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	   {
	     switch ( argv[i][1] )
	       {
	       case 'h': help_flag = true; break;
	       case 'r': read_mxf_flag = true; break;
	       case 'p': walk_parts_flag = true; break;
               case 's': allow_skip_flag = true; break;
	       case 'V': version_flag = true; break;
	       case 'v': verbose_flag = true; break;

	       default:
		 fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		 return;
	       }
	   }
	 else
	   {
	     if ( argv[i][0] != '-' )
	       inFileList.push_back(argv[i]);

	     else
	       {
       	         fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		 return;
	       }
	   }
       }

     if ( help_flag || version_flag )
       return;
     
     if ( inFileList.empty() )
       {
	 fputs("Input filename(s) required.\n", stderr);
	 return;
       }
     
     error_flag = false;
   }